

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

float Gia_ManEvaluateSwitching(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_20;
  float local_1c;
  int i;
  float SwitchTotal;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_1c = 0.0;
  if (p->pSwitching == (uchar *)0x0) {
    __assert_fail("p->pSwitching",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                  ,0x2d4,"float Gia_ManEvaluateSwitching(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  local_20 = 0;
  while( true ) {
    bVar2 = false;
    if (local_20 < p->nObjs) {
      _i = Gia_ManObj(p,local_20);
      bVar2 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjRefNum(p,_i);
    local_1c = ((float)iVar1 * (float)p->pSwitching[local_20]) / 255.0 + local_1c;
    local_20 = local_20 + 1;
  }
  return local_1c;
}

Assistant:

float Gia_ManEvaluateSwitching( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    float SwitchTotal = 0.0;
    int i;
    assert( p->pSwitching );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    Gia_ManForEachObj( p, pObj, i )
        SwitchTotal += (float)Gia_ObjRefNum(p, pObj) * p->pSwitching[i] / 255;
    return SwitchTotal;
}